

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

bool __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::reserve
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,size_t length)

{
  size_t sVar1;
  C *pCVar2;
  
  sVar1 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
  pCVar2 = createBuffer(this,length,true);
  if (pCVar2 != (C *)0x0) {
    (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = sVar1;
    (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p[sVar1] = '\0';
  }
  return pCVar2 != (C *)0x0;
}

Assistant:

bool
	reserve(size_t length) {
		size_t oldLength = this->m_length;
		if (!createBuffer(length, true))
			return false;

		ASSERT(this->m_isNullTerminated);
		this->m_length = oldLength; // restore original length
		this->m_p[oldLength] = 0;
		return true;
	}